

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::OutputMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,Converter *a_oConverter,char *a_pText)

{
  char *pcVar1;
  bool bVar2;
  char local_39;
  char *pcStack_38;
  char cEndOfLineChar;
  char *pEndOfLine;
  char *a_pText_local;
  Converter *a_oConverter_local;
  OutputWriter *a_oOutput_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  local_39 = *a_pText;
  pEndOfLine = a_pText;
  while( true ) {
    if (local_39 == '\0') {
      return true;
    }
    pcStack_38 = pEndOfLine;
    while( true ) {
      bVar2 = false;
      if (*pcStack_38 != '\0') {
        bVar2 = *pcStack_38 != '\n';
      }
      if (!bVar2) break;
      pcStack_38 = pcStack_38 + 1;
    }
    local_39 = *pcStack_38;
    *pcStack_38 = '\0';
    bVar2 = Converter::ConvertToStore(a_oConverter,pEndOfLine);
    if (!bVar2) break;
    *pcStack_38 = local_39;
    pEndOfLine = pcStack_38 + 1;
    pcVar1 = Converter::Data(a_oConverter);
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar1);
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
  }
  return false;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::OutputMultiLineText(
    OutputWriter &  a_oOutput,
    Converter &     a_oConverter,
    const SI_CHAR * a_pText
    ) const
{
    const SI_CHAR * pEndOfLine;
    SI_CHAR cEndOfLineChar = *a_pText;
    while (cEndOfLineChar) {
        // find the end of this line
        pEndOfLine = a_pText;
        for (; *pEndOfLine && *pEndOfLine != '\n'; ++pEndOfLine) /*loop*/ ;
        cEndOfLineChar = *pEndOfLine;

        // temporarily null terminate, convert and output the line
        *const_cast<SI_CHAR*>(pEndOfLine) = 0;
        if (!a_oConverter.ConvertToStore(a_pText)) {
            return false;
        }
        *const_cast<SI_CHAR*>(pEndOfLine) = cEndOfLineChar;
        a_pText += (pEndOfLine - a_pText) + 1;
        a_oOutput.Write(a_oConverter.Data());
        a_oOutput.Write(SI_NEWLINE_A);
    }
    return true;
}